

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgNameAllocator.cpp
# Opt level: O3

string * __thiscall
rsg::NameAllocator::allocate_abi_cxx11_(string *__return_storage_ptr__,NameAllocator *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->m_nextName;
  this->m_nextName = uVar2 + 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0x1a < uVar2) {
    do {
      uVar1 = uVar2 - 1;
      uVar2 = uVar1 / 0x1a;
      std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
    } while (0x2bd < uVar1);
  }
  std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,'\x01');
  return __return_storage_ptr__;
}

Assistant:

std::string NameAllocator::allocate (void)
{
	DE_ASSERT(m_nextName != 0);
	return nameNdxToStr(m_nextName++);
}